

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitAndAssign(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString result)

{
  Ref RVar1;
  Ref this_00;
  char *extraout_RDX;
  Ref in_R8;
  IString op;
  IString name;
  
  if (_finalize != result.str._M_str) {
    RVar1 = visit(wasm::Expression*,wasm::IString_(this,curr,result);
    name.str._M_str = extraout_RDX;
    name.str._M_len = (size_t)result.str._M_str;
    this_00 = cashew::ValueBuilder::makeName((ValueBuilder *)result.str._M_len,name);
    op.str._M_str = (char *)RVar1.inst;
    op.str._M_len = BLOCK;
    RVar1 = cashew::ValueBuilder::makeBinary(this_00.inst,cashew::SET,op,in_R8);
    return (Ref)RVar1.inst;
  }
  __assert_fail("result != NO_RESULT",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0x461,
                "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitAndAssign(Expression *, IString)"
               );
}

Assistant:

Ref visitAndAssign(Expression* curr, IString result) {
      assert(result != NO_RESULT);
      Ref ret = visit(curr, result);
      return ValueBuilder::makeStatement(
        ValueBuilder::makeBinary(ValueBuilder::makeName(result), SET, ret));
    }